

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::RepeatedStringFieldGenerator
          (RepeatedStringFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_FieldGenerator).descriptor_ = descriptor;
  (this->super_FieldGenerator).options_ = options;
  p_Var1 = &(this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header;
  (this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedStringFieldGenerator_004da3b0;
  anon_unknown_5::SetStringVariables(descriptor,&(this->super_FieldGenerator).variables_,options);
  return;
}

Assistant:

RepeatedStringFieldGenerator::RepeatedStringFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : FieldGenerator(descriptor, options) {
  SetStringVariables(descriptor, &variables_, options);
}